

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_sqrt_mips64(float32 xa,float_status *s)

{
  float32 fVar1;
  union_float32 ua;
  float local_14;
  
  local_14 = (float)xa;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      float32_input_flush__nocheck((float32 *)&local_14,s);
    }
    if ((((uint)local_14 >> 0x17) + 1 & 0xfe) == 0) {
      if (local_14 != 0.0) goto LAB_0079902f;
    }
    else if ((int)local_14 < 0) goto LAB_0079902f;
    if (local_14 < 0.0) {
      local_14 = sqrtf(local_14);
    }
    else {
      local_14 = SQRT(local_14);
    }
    return (float32)local_14;
  }
LAB_0079902f:
  fVar1 = soft_f32_sqrt((float32)local_14,s);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN float32_sqrt(float32 xa, float_status *s)
{
    union_float32 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float32_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F32_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float32_is_zero_or_normal(ua.s) ||
                        float32_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrtf(ua.h);
    return ur.s;

 soft:
    return soft_f32_sqrt(ua.s, s);
}